

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O0

void * Res_SatSimulateConstr(Abc_Ntk_t *pAig,int fOnSet)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar3;
  int iVar4;
  int fCompl1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  void *pvVar6;
  sat_solver *pSat_00;
  Abc_Obj_t *pAVar7;
  int local_40;
  int local_3c;
  int nNodes;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vFanins;
  sat_solver *pSat;
  int fOnSet_local;
  Abc_Ntk_t *pAig_local;
  
  p = Vec_PtrAlloc(2);
  pAVar5 = Abc_NtkPo(pAig,0);
  Vec_PtrPush(p,pAVar5);
  pAVar5 = Abc_NtkPo(pAig,1);
  Vec_PtrPush(p,pAVar5);
  p_00 = Abc_NtkDfsNodes(pAig,(Abc_Obj_t **)p->pArray,p->nSize);
  pAVar5 = Abc_AigConst1(pAig);
  (pAVar5->field_6).pTemp = (void *)0x0;
  local_40 = 1;
  for (local_3c = 0; iVar4 = Abc_NtkPiNum(pAig), local_3c < iVar4; local_3c = local_3c + 1) {
    pAVar5 = Abc_NtkPi(pAig,local_3c);
    pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)local_40;
    local_40 = local_40 + 1;
  }
  for (local_3c = 0; iVar4 = Vec_PtrSize(p_00), local_3c < iVar4; local_3c = local_3c + 1) {
    pvVar6 = Vec_PtrEntry(p_00,local_3c);
    *(long *)((long)pvVar6 + 0x40) = (long)local_40;
    local_40 = local_40 + 1;
  }
  for (local_3c = 0; iVar4 = Vec_PtrSize(p), local_3c < iVar4; local_3c = local_3c + 1) {
    pvVar6 = Vec_PtrEntry(p,local_3c);
    *(long *)((long)pvVar6 + 0x40) = (long)local_40;
    local_40 = local_40 + 1;
  }
  pSat_00 = sat_solver_new();
  pAVar5 = Abc_AigConst1(pAig);
  Res_SatAddConst1(pSat_00,(pAVar5->field_6).iTemp,0);
  for (local_3c = 0; iVar4 = Vec_PtrSize(p_00), local_3c < iVar4; local_3c = local_3c + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_3c);
    aVar2 = pAVar5->field_6;
    pAVar7 = Abc_ObjFanin0(pAVar5);
    aVar3 = pAVar7->field_6;
    pAVar7 = Abc_ObjFanin1(pAVar5);
    aVar1 = pAVar7->field_6;
    iVar4 = Abc_ObjFaninC0(pAVar5);
    fCompl1 = Abc_ObjFaninC1(pAVar5);
    Res_SatAddAnd(pSat_00,aVar2.iTemp,aVar3.iTemp,aVar1.iTemp,iVar4,fCompl1);
  }
  Vec_PtrFree(p_00);
  pAVar5 = Abc_NtkPo(pAig,0);
  aVar2 = pAVar5->field_6;
  pAVar7 = Abc_ObjFanin0(pAVar5);
  aVar3 = pAVar7->field_6;
  iVar4 = Abc_ObjFaninC0(pAVar5);
  Res_SatAddEqual(pSat_00,aVar2.iTemp,aVar3.iTemp,iVar4);
  pAVar5 = Abc_NtkPo(pAig,1);
  aVar2 = pAVar5->field_6;
  pAVar7 = Abc_ObjFanin0(pAVar5);
  aVar3 = pAVar7->field_6;
  iVar4 = Abc_ObjFaninC0(pAVar5);
  Res_SatAddEqual(pSat_00,aVar2.iTemp,aVar3.iTemp,iVar4);
  pAVar5 = Abc_NtkPo(pAig,0);
  Res_SatAddConst1(pSat_00,(pAVar5->field_6).iTemp,0);
  pAVar5 = Abc_NtkPo(pAig,1);
  Res_SatAddConst1(pSat_00,(pAVar5->field_6).iTemp,(uint)((fOnSet != 0 ^ 0xffU) & 1));
  Vec_PtrFree(p);
  return pSat_00;
}

Assistant:

void * Res_SatSimulateConstr( Abc_Ntk_t * pAig, int fOnSet )
{
    sat_solver * pSat;
    Vec_Ptr_t * vFanins;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, nNodes;

    // start the array
    vFanins = Vec_PtrAlloc( 2 );
    pObj = Abc_NtkPo( pAig, 0 );
    Vec_PtrPush( vFanins, pObj );
    pObj = Abc_NtkPo( pAig, 1 );
    Vec_PtrPush( vFanins, pObj );

    // collect reachable nodes
    vNodes = Abc_NtkDfsNodes( pAig, (Abc_Obj_t **)vFanins->pArray, vFanins->nSize );

    // assign unique numbers to each node
    nNodes = 0;
    Abc_AigConst1(pAig)->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Abc_NtkForEachPi( pAig, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i ) // useful POs
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;

    // start the solver
    pSat = sat_solver_new();

    // add clause for the constant node
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)Abc_AigConst1(pAig)->pCopy, 0 );
    // add clauses for AND gates
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Res_SatAddAnd( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, (int)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pCopy, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    Vec_PtrFree( vNodes );
    // add clauses for the first PO
    pObj = Abc_NtkPo( pAig, 0 );
    Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
        (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );
    // add clauses for the second PO
    pObj = Abc_NtkPo( pAig, 1 );
    Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
        (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );

    // add trivial clauses
    pObj = Abc_NtkPo( pAig, 0 );
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // care-set

    pObj = Abc_NtkPo( pAig, 1 );
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, !fOnSet ); // on-set

    Vec_PtrFree( vFanins );
    return pSat;
}